

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int selectColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  char *pcVar1;
  u8 uVar2;
  byte bVar3;
  sqlite3 *db;
  ExprList_item *pEVar4;
  Table *pTVar5;
  uint uVar6;
  ushort uVar7;
  int in_EAX;
  uint uVar8;
  int iVar9;
  int extraout_EAX;
  int extraout_EAX_00;
  Column *__s;
  Column *pCVar10;
  byte *pbVar11;
  byte *pbVar12;
  ulong uVar13;
  uint uVar14;
  Expr *pEVar15;
  char *pcVar16;
  byte *pbVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  
  db = pParse->db;
  if (pEList == (ExprList *)0x0) {
    __s = (Column *)0x0;
    uVar21 = 0;
  }
  else {
    uVar21 = (ulong)(uint)pEList->nExpr;
    iVar9 = pEList->nExpr * 0x30;
    __s = (Column *)sqlite3DbMallocRaw(db,iVar9);
    pCVar10 = __s;
    if (__s != (Column *)0x0) {
      pCVar10 = (Column *)memset(__s,0,(long)iVar9);
    }
    in_EAX = (int)pCVar10;
  }
  uVar18 = 0;
  *pnCol = (i16)uVar21;
  *paCol = __s;
  if (0 < (int)uVar21) {
    uVar20 = 0;
    pCVar10 = __s;
    do {
      pEVar4 = pEList->a;
      for (pEVar15 = pEVar4[uVar20].pExpr;
          (pEVar15 != (Expr *)0x0 && ((pEVar15->op == '\\' || (pEVar15->op == '\x18'))));
          pEVar15 = pEVar15->pLeft) {
      }
      pcVar16 = pEVar4[uVar20].zName;
      if (pcVar16 == (char *)0x0) {
        for (; uVar2 = pEVar15->op, uVar2 == 'v'; pEVar15 = pEVar15->pRight) {
        }
        if (uVar2 == '\x1a') {
          pcVar16 = (pEVar15->u).zToken;
        }
        else {
          if ((uVar2 == 0x98) && (pTVar5 = pEVar15->pTab, pTVar5 != (Table *)0x0)) {
            uVar7 = pEVar15->iColumn;
            if ((short)uVar7 < 0) {
              uVar7 = pTVar5->iPKey;
            }
            pcVar16 = "rowid";
            if (-1 < (short)uVar7) {
              pcVar16 = *(char **)((long)&pTVar5->aCol->zName + (ulong)((uint)uVar7 * 0x30));
            }
            pbVar11 = (byte *)sqlite3MPrintf(db,"%s",pcVar16);
            pbVar12 = pbVar11;
            goto LAB_00188d30;
          }
          pcVar16 = pEVar4[uVar20].zSpan;
        }
        pbVar11 = (byte *)sqlite3MPrintf(db,"%s",pcVar16);
        pbVar12 = pbVar11;
      }
      else {
        lVar22 = 0;
        do {
          pcVar1 = pcVar16 + lVar22;
          lVar22 = lVar22 + 1;
        } while (*pcVar1 != '\0');
        uVar18 = ((int)lVar22 - 1U & 0x3fffffff) + 1;
        pbVar11 = (byte *)sqlite3DbMallocRaw(db,uVar18);
        pbVar12 = pbVar11;
        if (pbVar11 != (byte *)0x0) {
          pbVar12 = (byte *)memcpy(pbVar11,pcVar16,(ulong)uVar18);
        }
      }
LAB_00188d30:
      if (db->mallocFailed != '\0') {
        sqlite3DbFree(db,pbVar11);
        in_EAX = extraout_EAX;
        break;
      }
      if (pbVar11 == (byte *)0x0) {
        uVar18 = 0;
      }
      else {
        uVar18 = 0xffffffff;
        pbVar12 = pbVar11;
        do {
          uVar18 = uVar18 + 1;
          bVar3 = *pbVar12;
          pbVar12 = pbVar12 + 1;
        } while (bVar3 != 0);
        uVar18 = uVar18 & 0x3fffffff;
      }
      in_EAX = (int)pbVar12;
      if (uVar20 != 0) {
        uVar19 = 0;
        pbVar12 = pbVar11;
        iVar9 = 0;
        do {
          pbVar11 = (byte *)__s[iVar9].zName;
          bVar3 = *pbVar11;
          pbVar17 = pbVar12;
          while ((bVar3 != 0 && (pbVar11 = pbVar11 + 1, ""[bVar3] == ""[*pbVar17]))) {
            pbVar17 = pbVar17 + 1;
            bVar3 = *pbVar11;
          }
          pbVar11 = pbVar12;
          if (""[bVar3] == ""[*pbVar17]) {
            uVar8 = 2;
            if ((int)uVar18 < 2) {
              uVar8 = uVar18;
            }
            uVar13 = (ulong)uVar18;
            uVar6 = uVar18;
            do {
              uVar13 = uVar13 - 1;
              uVar14 = uVar8 - 1;
              if ((int)uVar6 < 3) break;
              uVar14 = uVar6 - 1;
              uVar6 = uVar14;
            } while (0xfffffffffffffff5 < (ulong)pbVar12[uVar13 & 0xffffffff] - 0x3a);
            if (pbVar12[(int)uVar14] == 0x3a) {
              uVar18 = uVar14;
            }
            pbVar12[(int)uVar18] = 0;
            uVar19 = uVar19 + 1;
            pbVar11 = (byte *)sqlite3MPrintf(db,"%s:%d",pbVar12,(ulong)uVar19);
            sqlite3DbFree(db,pbVar12);
            in_EAX = -1;
            iVar9 = -1;
            if (pbVar11 == (byte *)0x0) break;
          }
          in_EAX = iVar9 + 1;
          pbVar12 = pbVar11;
          iVar9 = in_EAX;
        } while ((long)in_EAX < (long)uVar20);
      }
      pCVar10->zName = (char *)pbVar11;
      uVar20 = uVar20 + 1;
      pCVar10 = pCVar10 + 1;
    } while (uVar20 != uVar21);
    uVar18 = (uint)uVar20;
  }
  if (db->mallocFailed != '\0') {
    if (uVar18 != 0) {
      lVar22 = 0;
      do {
        sqlite3DbFree(db,*(void **)((long)&__s->zName + lVar22));
        lVar22 = lVar22 + 0x30;
      } while ((ulong)uVar18 * 0x30 != lVar22);
    }
    sqlite3DbFree(db,__s);
    *paCol = (Column *)0x0;
    *pnCol = 0;
    in_EAX = extraout_EAX_00;
  }
  return in_EAX;
}

Assistant:

static int selectColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  int cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  Expr *p;                    /* Expression for a single result column */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */

  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
  }else{
    nCol = 0;
    aCol = 0;
  }
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol; i++, pCol++){
    /* Get an appropriate name for the column
    */
    p = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
      zName = sqlite3DbStrDup(db, zName);
    }else{
      Expr *pColExpr = p;  /* The expression that is the result column name */
      Table *pTab;         /* Table associated with this expression */
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN && ALWAYS(pColExpr->pTab!=0) ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = sqlite3MPrintf(db, "%s",
                 iCol>=0 ? pTab->aCol[iCol].zName : "rowid");
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = sqlite3MPrintf(db, "%s", pColExpr->u.zToken);
      }else{
        /* Use the original text of the column expression as its name */
        zName = sqlite3MPrintf(db, "%s", pEList->a[i].zSpan);
      }
    }
    if( db->mallocFailed ){
      sqlite3DbFree(db, zName);
      break;
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append a integer to the name so that it becomes unique.
    */
    nName = sqlite3Strlen30(zName);
    for(j=cnt=0; j<i; j++){
      if( sqlite3StrICmp(aCol[j].zName, zName)==0 ){
        char *zNewName;
        int k;
        for(k=nName-1; k>1 && sqlite3Isdigit(zName[k]); k--){}
        if( zName[k]==':' ) nName = k;
        zName[nName] = 0;
        zNewName = sqlite3MPrintf(db, "%s:%d", zName, ++cnt);
        sqlite3DbFree(db, zName);
        zName = zNewName;
        j = -1;
        if( zName==0 ) break;
      }
    }
    pCol->zName = zName;
  }
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM;
  }
  return SQLITE_OK;
}